

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::TestGroupStats::~TestGroupStats(TestGroupStats *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TestGroupStats_002776c0;
  GroupInfo::~GroupInfo((GroupInfo *)0x1226d0);
  return;
}

Assistant:

TestGroupStats::~TestGroupStats() = default;